

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O0

LY_ERR structure_aug_sprinter_ctree
                 (lysc_ext_instance *ext,lyspr_tree_ctx *ctx,char **flags,char **add_opts)

{
  lysp_ext_instance *ext_00;
  int iVar1;
  LY_ERR LVar2;
  lysp_ext_instance *local_60;
  lysp_ext_instance *local_50;
  lysp_ext_instance *parsed_ext;
  uint64_t i;
  LY_ERR rc;
  char **add_opts_local;
  char **flags_local;
  lyspr_tree_ctx *ctx_local;
  lysc_ext_instance *ext_local;
  
  if (ctx == (lyspr_tree_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                  ,499,
                  "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
                 );
  }
  ext_00 = ext->module->parsed->exts;
  parsed_ext = (lysp_ext_instance *)0x0;
  while( true ) {
    if (ext_00 == (lysp_ext_instance *)0x0) {
      local_50 = (lysp_ext_instance *)0x0;
    }
    else {
      local_50 = ext_00[-1].exts;
    }
    if ((local_50 <= parsed_ext) ||
       ((iVar1 = strcmp(ext_00[(long)parsed_ext].name,"sx:augment-structure"), iVar1 == 0 &&
        (iVar1 = strcmp(ext_00[(long)parsed_ext].argument,ext->argument), iVar1 == 0)))) break;
    parsed_ext = (lysp_ext_instance *)((long)&parsed_ext->name + 1);
  }
  if (ext_00 == (lysp_ext_instance *)0x0) {
    local_60 = (lysp_ext_instance *)0x0;
  }
  else {
    local_60 = ext_00[-1].exts;
  }
  if (local_60 <= parsed_ext) {
    __assert_fail("i < LY_ARRAY_COUNT(parsed_ext)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                  ,0x1fc,
                  "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
                 );
  }
  LVar2 = structure_aug_sprinter_ptree(ext_00,ctx,flags,add_opts);
  return LVar2;
}

Assistant:

static LY_ERR
structure_aug_sprinter_ctree(struct lysc_ext_instance *ext, const struct lyspr_tree_ctx *ctx, const char **flags,
        const char **add_opts)
{
    LY_ERR rc = LY_SUCCESS;

    LY_ARRAY_COUNT_TYPE i;
    struct lysp_ext_instance *parsed_ext;

    assert(ctx);

    /* find the parsed ext structure */
    parsed_ext = ext->module->parsed->exts;
    LY_ARRAY_FOR(parsed_ext, i) {
        if (!strcmp(parsed_ext[i].name, "sx:augment-structure") && !strcmp(parsed_ext[i].argument, ext->argument)) {
            break;
        }
    }
    assert(i < LY_ARRAY_COUNT(parsed_ext));

    /* for augments print the parsed tree */
    rc = structure_aug_sprinter_ptree(parsed_ext, ctx, flags, add_opts);
    return rc;
}